

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
ans_load_interp(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
               uint8_t *in_u8)

{
  uint32_t *puVar1;
  uint *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint32_t uVar6;
  uint uVar7;
  uint8_t c;
  size_t n;
  ulong uVar8;
  uint uVar9;
  uint32_t *puVar10;
  ushort uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 local_78 [72];
  bool local_30;
  
  uVar7 = 0;
  uVar9 = 0;
  puVar1 = (uint32_t *)(in_u8 + 5);
  do {
    puVar10 = puVar1;
    uVar7 = uVar7 + ((*(byte *)((long)puVar10 + -5) & 0x7f) << (uVar9 & 0x1f));
    uVar9 = uVar9 + 7;
    puVar1 = (uint32_t *)((long)puVar10 + 1);
  } while ((char)*(byte *)((long)puVar10 + -5) < '\0');
  uVar6 = puVar10[-1];
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)(uVar7 + 1),(allocator_type *)local_78);
  puVar1 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  n = (long)(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  local_30 = false;
  local_78._24_8_ = local_78 + 8;
  local_78._40_8_ = local_78 + 0xc;
  local_78[0x30] = '\0';
  local_78._8_4_ = *(uint32_t *)((long)puVar10 + -3);
  local_78._56_16_ = ZEXT816(4) << 0x40;
  local_78._0_8_ = (uint32_t *)((long)puVar10 + 1);
  local_78._32_8_ = local_78._24_8_;
  interpolative_internal::decode_interpolative
            ((bit_stream *)local_78,puVar1,n,1,(1L << ((ulong)(byte)uVar6 & 0x3f)) + 2 + n);
  if ((local_30 == true) && (local_78[0x30] != '\0')) {
    *(uint32_t *)local_78._0_8_ = *(uint32_t *)local_78._24_8_;
  }
  if (uVar7 != 0) {
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    auVar12 = vpbroadcastd_avx512f(ZEXT416(*puVar2));
    auVar13 = vpbroadcastq_avx512f();
    uVar8 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar16,auVar14);
      auVar16 = vporq_avx512f(auVar16,auVar15);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar13,2);
      uVar4 = vpcmpuq_avx512f(auVar17,auVar13,2);
      bVar5 = (byte)uVar4;
      uVar11 = CONCAT11(bVar5,(byte)uVar3);
      auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar8 + 1));
      auVar17._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar16._4_4_;
      auVar17._0_4_ = (uint)((byte)uVar3 & 1) * auVar16._0_4_;
      auVar17._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar16._8_4_;
      auVar17._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar16._12_4_;
      auVar17._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar16._16_4_;
      auVar17._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar16._20_4_;
      auVar17._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar16._24_4_;
      auVar17._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar16._28_4_;
      auVar17._32_4_ = (uint)(bVar5 & 1) * auVar16._32_4_;
      auVar17._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar16._36_4_;
      auVar17._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar16._40_4_;
      auVar17._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar16._44_4_;
      auVar17._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar16._48_4_;
      auVar17._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar16._52_4_;
      auVar17._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar16._56_4_;
      auVar17._60_4_ = (uint)(bVar5 >> 7) * auVar16._60_4_;
      auVar12 = valignd_avx512f(auVar17,auVar12,0xf);
      auVar12 = vpternlogq_avx512f(auVar12,auVar12,auVar12,0xf);
      auVar12 = vpaddd_avx512f(auVar17,auVar12);
      auVar12 = vmovdqu32_avx512f(auVar12);
      *(undefined1 (*) [64])(puVar2 + uVar8 + 1) = auVar12;
      uVar8 = uVar8 + 0x10;
      auVar12 = vmovdqa64_avx512f(auVar17);
    } while (((ulong)uVar7 + 0xf & 0xfffffffffffffff0) != uVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> ans_load_interp(const uint8_t* in_u8)
{
    uint32_t max_sym = vbyte_decode_u32(in_u8);
    uint32_t frame_size = (1 << (*in_u8++));
    auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
    std::vector<uint32_t> vec(max_sym + 1);
    interpolative_internal::decode(
        in_ptr_u32, vec.data(), vec.size(), frame_size + vec.size() + 1);
    uint32_t prev = vec[0];
    uint32_t max_norm_freq = 0;
    for (size_t sym = 1; sym <= max_sym; sym++) {
        auto cur = vec[sym];
        vec[sym] = cur - prev - 1;
        max_norm_freq = std::max(max_norm_freq, vec[sym]);
        prev = cur;
    }
    return vec;
}